

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.cpp
# Opt level: O1

void __thiscall Centaurus::ATNMachine<wchar_t>::parse(ATNMachine<wchar_t> *this,Stream *stream)

{
  wchar_t wVar1;
  StreamException *__return_storage_ptr__;
  
  wVar1 = Stream::skip_whitespace(stream);
  if (wVar1 == L':') {
    Stream::get(stream);
    std::vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>::
    emplace_back<>(&this->m_nodes);
    parse_selection(this,stream);
    wVar1 = Stream::skip_whitespace(stream);
    if (wVar1 == L';') {
      Stream::get(stream);
      return;
    }
    __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
    Stream::unexpected(__return_storage_ptr__,stream,wVar1);
  }
  else {
    __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
    Stream::unexpected(__return_storage_ptr__,stream,wVar1);
  }
  __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,StreamException::~StreamException);
}

Assistant:

void ATNMachine<TCHAR>::parse(Stream& stream)
{
	wchar_t ch = stream.skip_whitespace();
	
	if (ch != L':')
		throw stream.unexpected(ch);
	stream.discard();

	m_nodes.emplace_back();
	parse_selection(stream);

	ch = stream.skip_whitespace();
	
	if (ch != L';')
		throw stream.unexpected(ch);
	stream.discard();
}